

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

void * omp_target_alloc(size_t size,int device_num)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  size_t in_RDI;
  DeviceTy *Device;
  void *rc;
  int in_stack_ffffffffffffffd0;
  void *local_8;
  
  if (in_RDI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    iVar2 = omp_get_initial_device();
    if (in_ESI == iVar2) {
      local_8 = malloc(in_RDI);
    }
    else {
      bVar1 = device_is_ready(in_stack_ffffffffffffffd0);
      if (bVar1) {
        pvVar3 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[](&Devices,(long)in_ESI)
        ;
        local_8 = (*pvVar3->RTL->data_alloc)(pvVar3->RTLDeviceID,in_RDI,(void *)0x0);
      }
      else {
        local_8 = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

EXTERN void *omp_target_alloc(size_t size, int device_num) {
  DP("Call to omp_target_alloc for device %d requesting %zu bytes\n",
      device_num, size);

  if (size <= 0) {
    DP("Call to omp_target_alloc with non-positive length\n");
    return NULL;
  }

  void *rc = NULL;

  if (device_num == omp_get_initial_device()) {
    rc = malloc(size);
    DP("omp_target_alloc returns host ptr " DPxMOD "\n", DPxPTR(rc));
    return rc;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_alloc returns NULL ptr\n");
    return NULL;
  }

  DeviceTy &Device = Devices[device_num];
  rc = Device.RTL->data_alloc(Device.RTLDeviceID, size, NULL);
  DP("omp_target_alloc returns device ptr " DPxMOD "\n", DPxPTR(rc));
  return rc;
}